

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  char cVar1;
  ushort uVar2;
  IRIns *pIVar3;
  ushort uVar4;
  AliasRet AVar5;
  TRef TVar6;
  uint uVar7;
  ulong uVar8;
  cTValue *pcVar9;
  uint uVar10;
  IRIns *pIVar11;
  IRIns *pIVar12;
  ulong uVar13;
  TValue keyv;
  TValue local_38;
  
  pIVar3 = (J->cur).ir;
  pIVar12 = pIVar3 + xref;
  uVar8 = (ulong)(J->fold).ins.field_1.o;
  uVar2 = J->chain[uVar8 + 7];
  while (uVar7 = (uint)uVar2, xref < uVar2) {
    uVar13 = (ulong)uVar2;
    AVar5 = aa_ahref(J,pIVar12,pIVar3 + pIVar3[uVar13].field_0.op1);
    uVar10 = uVar7;
    if (AVar5 == ALIAS_MAY) goto LAB_0012e00b;
    if (AVar5 == ALIAS_MUST) {
      return (uint)*(ushort *)((long)pIVar3 + uVar13 * 8 + 2);
    }
    uVar2 = *(ushort *)((long)pIVar3 + uVar13 * 8 + 6);
  }
  pIVar11 = pIVar12;
  if (((pIVar12->field_1).o & 0xfe) == 0x38) {
    pIVar11 = pIVar3 + (pIVar12->field_0).op1;
  }
  uVar2 = (pIVar11->field_0).op1;
  cVar1 = *(char *)((long)pIVar3 + (ulong)uVar2 * 8 + 5);
  uVar10 = xref;
  if ((cVar1 == 'N') || ((cVar1 == 'O' && (-1 < (short)(pIVar12->field_0).op2)))) {
    if ((pIVar12->field_1).o == 0x38) {
      for (uVar4 = J->chain[0x3b]; uVar2 < uVar4;
          uVar4 = *(ushort *)((long)pIVar3 + (ulong)uVar4 * 8 + 6)) {
        if ((*(byte *)((long)pIVar3 +
                      (ulong)*(ushort *)((long)pIVar3 + (ulong)uVar4 * 8 + 2) * 8 + 4) & 0x1f) ==
            0xe) goto LAB_0012e00b;
      }
    }
    if (uVar2 < uVar7) {
      do {
        uVar13 = (ulong)uVar7;
        AVar5 = aa_ahref(J,pIVar12,pIVar3 + pIVar3[uVar13].field_0.op1);
        if (AVar5 == ALIAS_MAY) goto LAB_0012e00b;
        if (AVar5 == ALIAS_MUST) {
          return (uint)*(ushort *)((long)pIVar3 + uVar13 * 8 + 2);
        }
        uVar4 = *(ushort *)((long)pIVar3 + uVar13 * 8 + 6);
        uVar7 = (uint)uVar4;
      } while (uVar2 < uVar4);
    }
    uVar7 = (J->fold).ins.field_1.t.irt & 0x1f;
    if ((byte)uVar7 < 3) {
      return (uVar7 << 0x18 | uVar7) ^ 0x7fff;
    }
    if (((byte)uVar7 == 0xe) || (uVar7 == 4)) {
      pIVar12 = pIVar3 + (pIVar12->field_0).op2;
      if ((pIVar12->field_1).o == '\x1d') {
        pIVar12 = pIVar3 + (pIVar12->field_0).op1;
      }
      lj_ir_kvalue(J->L,&local_38,pIVar12);
      pcVar9 = lj_tab_get(J->L,(GCtab *)(ulong)(J->cur).ir[pIVar3[uVar2].field_0.op1].field_1.op12,
                          &local_38);
      if (((J->fold).ins.field_1.t.irt & 0x1f) == 0xe) {
        TVar6 = lj_ir_knum_u64(J,pcVar9->u64);
        return TVar6;
      }
      TVar6 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar9->u32).lo,IRT_STR);
      return TVar6;
    }
  }
LAB_0012e00b:
  uVar2 = J->chain[uVar8];
  while( true ) {
    uVar7 = (uint)uVar2;
    if (uVar7 <= uVar10) {
      return 0;
    }
    if (pIVar3[uVar7].field_0.op1 == xref) break;
    uVar2 = *(ushort *)((long)pIVar3 + (ulong)uVar7 * 8 + 6);
  }
  return uVar7;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if (ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      lua_assert(ir->o != IR_TNEW || irt_isnil(fins->t));
      if (irt_ispri(fins->t)) {
	return TREF_PRI(irt_type(fins->t));
      } else if (irt_isnum(fins->t) || (LJ_DUALNUM && irt_isint(fins->t)) ||
		 irt_isstr(fins->t)) {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	lua_assert(itype2irt(tv) == irt_type(fins->t));
	if (irt_isnum(fins->t))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (LJ_DUALNUM && irt_isint(fins->t))
	  return lj_ir_kint(J, intV(tv));
	else
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}